

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Spc_Emu::load_mem_(Spc_Emu *this,byte_ *in,long size)

{
  gme_type_t in_RDX;
  _func_int **in_RSI;
  Music_Emu *in_RDI;
  void *in_stack_ffffffffffffffd8;
  char *local_8;
  
  in_RDI[1].super_Gme_File._vptr_Gme_File = in_RSI;
  in_RDI[1].super_Gme_File.type_ = in_RDX;
  Music_Emu::set_voice_count(in_RDI,8);
  if ((long)in_RDX < 0x10180) {
    local_8 = "Wrong file type for this emulator";
  }
  else {
    local_8 = check_spc_header(in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

blargg_err_t Spc_Emu::load_mem_( byte const* in, long size )
{
	assert( offsetof (header_t,unused2 [46]) == header_size );
	file_data = in;
	file_size = size;
	set_voice_count( Snes_Spc::voice_count );
	if ( size < Snes_Spc::spc_min_file_size )
		return gme_wrong_file_type;
	return check_spc_header( in );
}